

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::TypePrinter::TypePrinter
          (TypePrinter *this,PrintSExpression *parent,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  __node_base_ptr this_00;
  bool bVar1;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_01;
  reference __in;
  type *__x;
  reference pHVar2;
  size_type sVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar4;
  size_type sVar5;
  mapped_type *this_02;
  TypeNames local_158;
  string local_110;
  Name local_f0;
  undefined1 auStack_e0 [8];
  Name name;
  HeapType type;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  size_t i;
  type *names;
  type *_;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_70;
  iterator __end2;
  iterator __begin2;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *__range2;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  PrintSExpression *parent_local;
  TypePrinter *this_local;
  
  usedNames._M_h._M_single_bucket = (__node_base_ptr)types;
  TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter>::TypeNameGeneratorBase
            ((TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter> *)this);
  this->parent = parent;
  DefaultTypeNameGenerator::DefaultTypeNameGenerator(&this->fallback);
  std::
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  ::unordered_map(&this->fallbackNames);
  if (parent->currModule != (Module *)0x0) {
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&__range2);
    this_01 = &parent->currModule->typeNames;
    __end2 = std::
             unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
             ::begin(this_01);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
         ::end(this_01);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                              ,&local_70), this_00 = usedNames._M_h._M_single_bucket, bVar1) {
      __in = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
             operator*(&__end2);
      std::get<0ul,wasm::HeapType_const,wasm::TypeNames>(__in);
      __x = std::get<1ul,wasm::HeapType_const,wasm::TypeNames>(__in);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&__range2,&__x->name);
      std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
      operator++(&__end2);
    }
    __range2_1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0;
    __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          usedNames._M_h._M_single_bucket);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                               *)&type), bVar1) {
      pHVar2 = __gnu_cxx::
               __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2_1);
      name.super_IString.str._M_str = (char *)pHVar2->id;
      sVar3 = std::
              unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
              ::count(&parent->currModule->typeNames,(key_type *)&name.super_IString.str._M_str);
      if (sVar3 == 0) {
        wasm::Name::Name((Name *)auStack_e0);
        do {
          pvVar4 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   ((long)&(__range2_1->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
          std::__cxx11::to_string(&local_110,(unsigned_long)__range2_1);
          wasm::Name::Name(&local_f0,&local_110);
          wasm::Name::operator=((Name *)auStack_e0,&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          sVar5 = std::
                  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&__range2,(key_type *)auStack_e0);
          __range2_1 = pvVar4;
        } while (sVar5 != 0);
        local_158.name.super_IString.str._M_len = (size_t)auStack_e0;
        local_158.name.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        local_158.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        local_158.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
        local_158.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
        local_158.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_158.fieldNames._M_h._M_element_count = 0;
        local_158.fieldNames._M_h._M_buckets = (__buckets_ptr)0x0;
        local_158.fieldNames._M_h._M_bucket_count = 0;
        local_158.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
        std::
        unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
        ::unordered_map(&local_158.fieldNames);
        this_02 = std::
                  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                  ::operator[](&this->fallbackNames,(key_type *)&name.super_IString.str._M_str);
        TypeNames::operator=(this_02,&local_158);
        TypeNames::~TypeNames(&local_158);
      }
      else {
        __range2_1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     ((long)&(__range2_1->
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1);
      }
      __gnu_cxx::
      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2_1);
    }
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&__range2);
  }
  return;
}

Assistant:

TypePrinter(PrintSExpression& parent, const std::vector<HeapType>& types)
      : parent(parent) {
      if (!parent.currModule) {
        return;
      }
      std::unordered_set<Name> usedNames;
      for (auto& [_, names] : parent.currModule->typeNames) {
        usedNames.insert(names.name);
      }
      size_t i = 0;
      // Use indices for any remaining type names, skipping any that are already
      // used.
      for (auto type : types) {
        if (parent.currModule->typeNames.count(type)) {
          ++i;
          continue;
        }
        Name name;
        do {
          name = std::to_string(i++);
        } while (usedNames.count(name));
        fallbackNames[type] = {name, {}};
      }
    }